

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

bool __thiscall
chaiscript::dispatch::Proxy_Function_Base::filter
          (Proxy_Function_Base *this,Function_Params *vals,Type_Conversions_State *t_conversions)

{
  size_t sVar1;
  const_reference pvVar2;
  Boxed_Value *pBVar3;
  bool bVar4;
  bool local_3a;
  Type_Conversions_State *t_conversions_local;
  Function_Params *vals_local;
  Proxy_Function_Base *this_local;
  
  bVar4 = true;
  if ((this->m_arity != -1) && (bVar4 = false, 0 < this->m_arity)) {
    sVar1 = Function_Params::size(vals);
    bVar4 = (int)sVar1 == this->m_arity;
  }
  if (bVar4) {
    if (this->m_arity < 0) {
      this_local._7_1_ = true;
    }
    else if (this->m_arity < 2) {
      pvVar2 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
               operator[](&this->m_types,1);
      pBVar3 = Function_Params::operator[](vals,0);
      this_local._7_1_ = compare_type_to_param(pvVar2,pBVar3,t_conversions);
    }
    else {
      pvVar2 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
               operator[](&this->m_types,1);
      pBVar3 = Function_Params::operator[](vals,0);
      bVar4 = compare_type_to_param(pvVar2,pBVar3,t_conversions);
      local_3a = false;
      if (bVar4) {
        pvVar2 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
                 operator[](&this->m_types,2);
        pBVar3 = Function_Params::operator[](vals,1);
        local_3a = compare_type_to_param(pvVar2,pBVar3,t_conversions);
      }
      this_local._7_1_ = local_3a;
    }
    return this_local._7_1_;
  }
  __assert_fail("m_arity == -1 || (m_arity > 0 && static_cast<int>(vals.size()) == m_arity)",
                "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/dispatchkit/proxy_functions.hpp"
                ,0xcf,
                "bool chaiscript::dispatch::Proxy_Function_Base::filter(const Function_Params &, const Type_Conversions_State &) const"
               );
}

Assistant:

bool filter(const Function_Params &vals, const Type_Conversions_State &t_conversions) const noexcept {
        assert(m_arity == -1 || (m_arity > 0 && static_cast<int>(vals.size()) == m_arity));

        if (m_arity < 0) {
          return true;
        } else if (m_arity > 1) {
          return compare_type_to_param(m_types[1], vals[0], t_conversions) && compare_type_to_param(m_types[2], vals[1], t_conversions);
        } else {
          return compare_type_to_param(m_types[1], vals[0], t_conversions);
        }
      }